

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall wabt::ExportModuleField::~ExportModuleField(ExportModuleField *this)

{
  ExportModuleField *this_local;
  
  ~ExportModuleField(this);
  operator_delete(this);
  return;
}

Assistant:

explicit ExportModuleField(const Location& loc = Location())
      : ModuleFieldMixin<ModuleFieldType::Export>(loc) {}